

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::PubkeyData,cfd::js::api::json::SchnorrPubkeyData,cfd::js::api::PubkeyDataStruct,cfd::js::api::SchnorrPubkeyDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::PubkeyDataStruct_&)>
          *call_function)

{
  ErrorResponse local_558;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_4a0 [4];
  JsonClassBase<cfd::js::api::json::SchnorrPubkeyData> local_480 [4];
  undefined1 local_460 [8];
  SchnorrPubkeyData res_2;
  undefined1 local_3f8 [8];
  SchnorrPubkeyDataStruct response;
  PubkeyDataStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_78 [8];
  PubkeyData req;
  function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::PubkeyDataStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._80_8_ = call_function;
  PubkeyData::PubkeyData((PubkeyData *)local_78);
  core::JsonClassBase<cfd::js::api::json::PubkeyData>::Deserialize
            ((JsonClassBase<cfd::js::api::json::PubkeyData> *)local_78,request_message);
  PubkeyData::ConvertToStruct
            ((PubkeyDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PubkeyData *)local_78);
  std::function<cfd::js::api::SchnorrPubkeyDataStruct_(const_cfd::js::api::PubkeyDataStruct_&)>::
  operator()((SchnorrPubkeyDataStruct *)local_3f8,call_function,
             (PubkeyDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._95_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._32_4_ == 0) {
    SchnorrPubkeyData::SchnorrPubkeyData((SchnorrPubkeyData *)local_460);
    SchnorrPubkeyData::ConvertFromStruct
              ((SchnorrPubkeyData *)local_460,(SchnorrPubkeyDataStruct *)local_3f8);
    core::JsonClassBase<cfd::js::api::json::SchnorrPubkeyData>::Serialize_abi_cxx11_(local_480);
    std::__cxx11::string::operator=((string *)this,(string *)local_480);
    std::__cxx11::string::~string((string *)local_480);
    SchnorrPubkeyData::~SchnorrPubkeyData((SchnorrPubkeyData *)local_460);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_558,(InnerErrorResponseStruct *)&response.parity);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_4a0);
    std::__cxx11::string::operator=((string *)this,(string *)local_4a0);
    std::__cxx11::string::~string((string *)local_4a0);
    ErrorResponse::~ErrorResponse(&local_558);
  }
  res_2._95_1_ = 1;
  SchnorrPubkeyDataStruct::~SchnorrPubkeyDataStruct((SchnorrPubkeyDataStruct *)local_3f8);
  PubkeyDataStruct::~PubkeyDataStruct
            ((PubkeyDataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PubkeyData::~PubkeyData((PubkeyData *)local_78);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}